

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiID __thiscall ImGuiWindow::GetIDFromRectangle(ImGuiWindow *this,ImRect *r_abs)

{
  ImU32 IVar1;
  value_type_conflict3 *pvVar2;
  float fVar3;
  float fVar4;
  int local_28;
  int iStack_24;
  int iStack_20;
  int iStack_1c;
  
  pvVar2 = ImVector<unsigned_int>::back(&this->IDStack);
  fVar3 = (this->Pos).x;
  fVar4 = (this->Pos).y;
  local_28 = (int)((r_abs->Min).x - fVar3);
  iStack_24 = (int)((r_abs->Min).y - fVar4);
  iStack_20 = (int)((r_abs->Max).x - fVar3);
  iStack_1c = (int)((r_abs->Max).y - fVar4);
  IVar1 = ImHash(&local_28,0x10,*pvVar2);
  if (GImGui->ActiveId == IVar1) {
    GImGui->ActiveIdIsAlive = true;
  }
  return IVar1;
}

Assistant:

ImGuiID ImGuiWindow::GetIDFromRectangle(const ImRect& r_abs)
{
    ImGuiID seed = IDStack.back();
    const int r_rel[4] = { (int)(r_abs.Min.x - Pos.x), (int)(r_abs.Min.y - Pos.y), (int)(r_abs.Max.x - Pos.x), (int)(r_abs.Max.y - Pos.y) };
    ImGuiID id = ImHash(&r_rel, sizeof(r_rel), seed);
    ImGui::KeepAliveID(id);
    return id;
}